

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O2

bool __thiscall TypeInfo::testComplexTypes(TypeInfo *this)

{
  bool bVar1;
  DOMElement *pDVar2;
  long *plVar3;
  XMLCh *pXVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  wchar16 *pwVar8;
  long *plVar9;
  undefined1 uVar10;
  XStr local_30;
  XStr local_28;
  
  (**(code **)(*(long *)this->doc + 0x68))();
  XStr::XStr(&local_30,"complexTest");
  pDVar2 = findElement(this,local_30.fUnicodeForm);
  XStr::~XStr(&local_30);
  plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x1d8))(pDVar2);
  pXVar4 = (XMLCh *)(**(code **)(*plVar3 + 0x10))(plVar3);
  XStr::XStr(&local_30,"complexTestType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar4,local_30.fUnicodeForm);
  if (bVar1) {
    plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x1d8))(pDVar2);
    pXVar4 = (XMLCh *)(**(code **)(*plVar3 + 0x18))(plVar3);
    XStr::XStr(&local_28,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar4,local_28.fUnicodeForm);
    XStr::~XStr(&local_28);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_30);
  uVar10 = tmp;
  if (tmp == false) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1de);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_30,"complexTestType");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_28,"");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (local_28.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_28);
    XStr::~XStr(&local_30);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x1d8))(pDVar2);
    lVar7 = (**(code **)(*plVar3 + 0x10))(plVar3);
    if (lVar7 == 0) {
      pcVar6 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x1d8))(pDVar2);
      pwVar8 = (wchar16 *)(**(code **)(*plVar3 + 0x10))(plVar3);
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar6);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x1d8))(pDVar2);
    lVar7 = (**(code **)(*plVar3 + 0x18))(plVar3);
    if (lVar7 == 0) {
      pcVar6 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x1d8))(pDVar2);
      pwVar8 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar6);
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x50))(pDVar2);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar9 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar4 = (XMLCh *)(**(code **)(*plVar9 + 0x10))(plVar9);
  XStr::XStr(&local_30,"complexDerTestType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar4,local_30.fUnicodeForm);
  if (bVar1) {
    plVar9 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar4 = (XMLCh *)(**(code **)(*plVar9 + 0x18))(plVar9);
    XStr::XStr(&local_28,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar4,local_28.fUnicodeForm);
    XStr::~XStr(&local_28);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_30);
  if (tmp == false) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e1);
    poVar5 = std::operator<<(poVar5,"\nExpected values : typename \'");
    XStr::XStr(&local_30,"complexDerTestType");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\', uri \'");
    XStr::XStr(&local_28,"");
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (local_28.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar5,pcVar6);
    XStr::~XStr(&local_28);
    XStr::~XStr(&local_30);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar9 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar7 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar7 == 0) {
      pcVar6 = "(null)";
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar8 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar6);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar9 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar7 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar7 == 0) {
      pcVar6 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar8 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar6);
    poVar5 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar10 = 0;
  }
  return (bool)uVar10;
}

Assistant:

bool TypeInfo::testComplexTypes() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning

    //element complexTest
    DOMElement *testEle = findElement(X("complexTest"));
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexTestType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("complexDerTestType"), X(""), __LINE__);
    return passed;
}